

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O0

void __thiscall NetworkError::NetworkError(NetworkError *this,int type,string *id)

{
  string local_40 [32];
  string *local_20;
  string *id_local;
  NetworkError *pNStack_10;
  int type_local;
  NetworkError *this_local;
  
  local_20 = id;
  id_local._4_4_ = type;
  pNStack_10 = this;
  ENerror::ENerror(&this->super_ENerror);
  (this->super_ENerror)._vptr_ENerror = (_func_int **)&PTR__NetworkError_0019ead8;
  if ((-1 < id_local._4_4_) && (id_local._4_4_ < 9)) {
    (this->super_ENerror).code = NetworkErrorCodes[id_local._4_4_];
    std::operator+((char *)local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   NetworkErrorMsgs[id_local._4_4_]);
    std::__cxx11::string::operator=((string *)&(this->super_ENerror).msg,local_40);
    std::__cxx11::string::~string(local_40);
  }
  return;
}

Assistant:

NetworkError::NetworkError(int type, string id)
{
    if (type >= 0 && type < NETWORK_ERROR_LIMIT)
    {
        code = NetworkErrorCodes[type];
        msg = NetworkErrorMsgs[type] + id;
    }
}